

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall
Frame::Frame(Frame *this,ClassRuntime *classRuntime,string *methodName,string *methodDescriptor,
            vector<Value,_std::allocator<Value>_> *arguments)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  pointer pcVar3;
  undefined8 uVar4;
  anon_union_8_10_52016fac_for_data aVar5;
  attribute_info *paVar6;
  u2 uVar7;
  u2 uVar8;
  u2 uVar9;
  mapped_type *pmVar10;
  method_info *pmVar11;
  ulong uVar12;
  long lVar13;
  pointer pVVar14;
  key_type local_9c;
  map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
  *local_98;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *local_90;
  ClassRuntime *local_88;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  this->pc = 0;
  this->_object = (ClassInstance *)0x0;
  local_98 = &this->_localVariables;
  p_Var1 = &(this->_localVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  local_90 = &this->_operandStack;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88 = classRuntime;
  local_78 = methodDescriptor;
  std::_Deque_base<Value,_std::allocator<Value>_>::_M_initialize_map
            ((_Deque_base<Value,_std::allocator<Value>_> *)local_90,0);
  pVVar14 = (arguments->super__Vector_base<Value,_std::allocator<Value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_80 = methodName;
  if ((arguments->super__Vector_base<Value,_std::allocator<Value>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pVVar14) {
    lVar13 = 0;
    uVar12 = 0;
    do {
      local_9c = (key_type)uVar12;
      pmVar10 = std::
                map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
                ::operator[](local_98,&local_9c);
      puVar2 = (undefined8 *)((long)&pVVar14->printType + lVar13);
      uVar4 = *puVar2;
      aVar5 = *(anon_union_8_10_52016fac_for_data *)(puVar2 + 1);
      pmVar10->printType = (int)uVar4;
      pmVar10->type = (int)((ulong)uVar4 >> 0x20);
      pmVar10->data = aVar5;
      uVar12 = uVar12 + 1;
      pVVar14 = (arguments->super__Vector_base<Value,_std::allocator<Value>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x10;
    } while (uVar12 < (ulong)((long)(arguments->super__Vector_base<Value,_std::allocator<Value>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 4))
    ;
  }
  pcVar3 = (local_80->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + local_80->_M_string_length);
  pcVar3 = (local_78->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + local_78->_M_string_length);
  pmVar11 = getMethodNamed(this,local_88,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (pmVar11 != (method_info *)0x0) {
    uVar7 = pmVar11->name_index;
    uVar8 = pmVar11->descriptor_index;
    uVar9 = pmVar11->attributes_count;
    paVar6 = pmVar11->attributes;
    (this->_method).access_flags = pmVar11->access_flags;
    (this->_method).name_index = uVar7;
    (this->_method).descriptor_index = uVar8;
    (this->_method).attributes_count = uVar9;
    (this->_method).attributes = paVar6;
    if (((this->_method).access_flags & 8) != 0) {
      findAttributes(this);
      return;
    }
    __assert_fail("(_method.access_flags & 0x0008) != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/frame.cpp"
                  ,0x23,"Frame::Frame(ClassRuntime *, string, string, vector<Value>)");
  }
  __assert_fail("method != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/frame.cpp",
                0x21,"Frame::Frame(ClassRuntime *, string, string, vector<Value>)");
}

Assistant:

Frame::Frame(ClassRuntime *classRuntime, string methodName, string methodDescriptor, vector<Value> arguments) : pc(0), _object(NULL) {
    
    for (int i = 0; i < arguments.size(); i++) {
        _localVariables[i] = arguments[i];
    }
    
    method_info *method = getMethodNamed(classRuntime, methodName, methodDescriptor);
    assert(method != NULL);
    _method = *method;
    assert((_method.access_flags & 0x0008) != 0); // o método precisa ser estático
    
    findAttributes();
}